

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

bool __thiscall QFileSystemModel::hasChildren(QFileSystemModel *this,QModelIndex *parent)

{
  Type TVar1;
  quintptr qVar2;
  
  if (parent->c < 1) {
    if (parent->c != 0) {
      return true;
    }
    if (parent->r < 0) {
      return true;
    }
    if ((parent->m).ptr == (QAbstractItemModel *)0x0) {
      return true;
    }
    if ((parent->m).ptr == (QAbstractItemModel *)0x0) {
      qVar2 = *(long *)&this->field_0x8 + 0x138;
    }
    else {
      qVar2 = parent->i;
    }
    if (*(QExtendedInformation **)(qVar2 + 0x38) != (QExtendedInformation *)0x0) {
      TVar1 = QExtendedInformation::type(*(QExtendedInformation **)(qVar2 + 0x38));
      return TVar1 == Dir;
    }
    if (*(long *)(qVar2 + 0x18) != 0) {
      return 0 < *(long *)(*(long *)(qVar2 + 0x18) + 8);
    }
  }
  return false;
}

Assistant:

bool QFileSystemModel::hasChildren(const QModelIndex &parent) const
{
    Q_D(const QFileSystemModel);
    if (parent.column() > 0)
        return false;

    if (!parent.isValid()) // drives
        return true;

    const QFileSystemModelPrivate::QFileSystemNode *indexNode = d->node(parent);
    Q_ASSERT(indexNode);
    return (indexNode->isDir());
}